

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O2

char * Kit_PlaFromTruthNew(uint *pTruth,int nVars,Vec_Int_t *vCover,Vec_Str_t *vStr)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  ABC_UINT64_T AVar4;
  ABC_UINT64_T AVar5;
  int i;
  long lVar6;
  
  uVar1 = Kit_TruthIsop(pTruth,nVars,vCover,1);
  if (1 < uVar1) {
    __assert_fail("RetValue == 0 || RetValue == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                  ,0x19b,"char *Kit_PlaFromTruthNew(unsigned int *, int, Vec_Int_t *, Vec_Str_t *)")
    ;
  }
  if (vCover->nSize == 0) {
LAB_004d0727:
    if (uVar1 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                    ,0x19f,
                    "char *Kit_PlaFromTruthNew(unsigned int *, int, Vec_Int_t *, Vec_Str_t *)");
    }
    vStr->nSize = 0;
    pcVar3 = " 1\n";
    if (vCover->nSize == 0) {
      pcVar3 = " 0\n";
    }
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      Vec_StrPush(vStr,pcVar3[lVar6]);
    }
    Vec_StrPush(vStr,'\0');
    pcVar3 = vStr->pArray;
  }
  else {
    if (vCover->nSize == 1) {
      iVar2 = Vec_IntEntry(vCover,0);
      if (iVar2 == 0) goto LAB_004d0727;
    }
    pcVar3 = Kit_PlaFromIsop(vStr,nVars,vCover);
    if (uVar1 != 0) {
      Kit_PlaComplement(pcVar3);
    }
    if (nVars < 6) {
      uVar1 = *pTruth;
      AVar4 = Kit_PlaToTruth6(pcVar3,nVars);
      if (uVar1 != (uint)AVar4) {
        __assert_fail("pTruth[0] == (unsigned)Kit_PlaToTruth6(pResult, nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                      ,0x1a9,
                      "char *Kit_PlaFromTruthNew(unsigned int *, int, Vec_Int_t *, Vec_Str_t *)");
      }
    }
    else if (nVars == 6) {
      AVar4 = *(ABC_UINT64_T *)pTruth;
      AVar5 = Kit_PlaToTruth6(pcVar3,6);
      if (AVar4 != AVar5) {
        __assert_fail("*((ABC_UINT64_T*)pTruth) == Kit_PlaToTruth6(pResult, nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                      ,0x1ab,
                      "char *Kit_PlaFromTruthNew(unsigned int *, int, Vec_Int_t *, Vec_Str_t *)");
      }
    }
  }
  return pcVar3;
}

Assistant:

char * Kit_PlaFromTruthNew( unsigned * pTruth, int nVars, Vec_Int_t * vCover, Vec_Str_t * vStr )
{
    char * pResult;
    // transform truth table into the SOP
    int RetValue = Kit_TruthIsop( pTruth, nVars, vCover, 1 );
    assert( RetValue == 0 || RetValue == 1 );
    // check the case of constant cover
    if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover,0) == 0) )
    {
        assert( RetValue == 0 );
        Vec_StrClear( vStr );
        Vec_StrAppend( vStr, (Vec_IntSize(vCover) == 0) ? " 0\n" : " 1\n" );
        Vec_StrPush( vStr, '\0' );
        return Vec_StrArray( vStr );
    }
    pResult = Kit_PlaFromIsop( vStr, nVars, vCover );
    if ( RetValue )
        Kit_PlaComplement( pResult );
    if ( nVars < 6 )
        assert( pTruth[0] == (unsigned)Kit_PlaToTruth6(pResult, nVars) );
    else if ( nVars == 6 )
        assert( *((ABC_UINT64_T*)pTruth) == Kit_PlaToTruth6(pResult, nVars) );
    return pResult;
}